

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int __thiscall ON_SubDEdgeSharpness::Trend(ON_SubDEdgeSharpness *this)

{
  ON_SubDEdgeSharpness *this_local;
  
  if (this->m_edge_sharpness[1] <= this->m_edge_sharpness[0]) {
    if (this->m_edge_sharpness[0] < this->m_edge_sharpness[1] ||
        this->m_edge_sharpness[0] == this->m_edge_sharpness[1]) {
      if ((this->m_edge_sharpness[0] != this->m_edge_sharpness[1]) ||
         (NAN(this->m_edge_sharpness[0]) || NAN(this->m_edge_sharpness[1]))) {
        this_local._4_4_ = -0x7fffffff;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int ON_SubDEdgeSharpness::Trend() const
{

  if (m_edge_sharpness[0] < m_edge_sharpness[1])
    return 1;
  if (m_edge_sharpness[0] > m_edge_sharpness[1])
    return -1;
  if (m_edge_sharpness[0] == m_edge_sharpness[1])
    return 0;
  return ON_UNSET_INT_INDEX;
}